

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrCore.c
# Opt level: O1

int Pdr_ManPushClauses(Pdr_Man_t *p)

{
  uint uVar1;
  void *pvVar2;
  uint *puVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  Pdr_Set_t *pPVar8;
  void *pvVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  Pdr_Set_t *pPVar16;
  ulong uVar17;
  ulong uVar18;
  timespec ts;
  long local_68;
  timespec local_60;
  ulong local_50;
  uint *local_48;
  ulong local_40;
  ulong local_38;
  
  if (p->pPars->fShiftStart == 0) {
    uVar14 = 1;
  }
  else {
    uVar14 = p->iUseFrame;
  }
  uVar11 = p->vSolvers->nSize;
  iVar4 = clock_gettime(3,&local_60);
  if (iVar4 < 0) {
    local_68 = 1;
  }
  else {
    lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_60.tv_nsec),8);
    local_68 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_60.tv_sec * -1000000;
  }
  if (p->iUseFrame < 1) {
    __assert_fail("p->iUseFrame > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrCore.c"
                  ,0x9d,"int Pdr_ManPushClauses(Pdr_Man_t *)");
  }
  uVar5 = uVar11 - 1;
  iVar4 = 0;
  local_50 = (ulong)uVar11;
  if ((int)uVar14 < (int)uVar5) {
    iVar4 = 0;
    uVar17 = (ulong)uVar14;
    while ((-1 < (int)uVar14 && ((int)uVar17 < p->vClauses->nSize))) {
      pvVar2 = p->vClauses->pArray[uVar17];
      if (1 < (long)*(int *)((long)pvVar2 + 4)) {
        qsort(*(void **)((long)pvVar2 + 8),(long)*(int *)((long)pvVar2 + 4),8,Pdr_SetCompare);
      }
      uVar18 = uVar17 + 1;
      iVar15 = (int)uVar18;
      if (p->vClauses->nSize <= iVar15) break;
      iVar6 = *(int *)((long)pvVar2 + 4);
      if (0 < iVar6) {
        local_48 = (uint *)p->vClauses->pArray[uVar18];
        uVar13 = 0;
        local_40 = uVar17;
        do {
          iVar12 = (int)uVar13;
          if (iVar12 < 0) goto LAB_005e78e2;
          pPVar16 = *(Pdr_Set_t **)(*(long *)((long)pvVar2 + 8) + uVar13 * 8);
          uVar11 = iVar12 + 1;
          local_38 = uVar13;
          if ((int)uVar11 < *(int *)((long)pvVar2 + 4)) {
            do {
              if ((int)uVar13 < -1) goto LAB_005e78e2;
              pPVar8 = *(Pdr_Set_t **)(*(long *)((long)pvVar2 + 8) + (ulong)uVar11 * 8);
              iVar6 = Pdr_SetContains(pPVar8,pPVar16);
              if (iVar6 == 0) {
                uVar13 = (ulong)uVar11;
              }
              else {
                Pdr_SetDeref(pPVar8);
                iVar6 = *(int *)((long)pvVar2 + 4);
                if ((long)iVar6 < 1) goto LAB_005e7901;
                if (iVar6 <= (int)uVar11) goto LAB_005e7920;
                *(undefined8 *)(*(long *)((long)pvVar2 + 8) + (ulong)uVar11 * 8) =
                     *(undefined8 *)(*(long *)((long)pvVar2 + 8) + -8 + (long)iVar6 * 8);
                *(int *)((long)pvVar2 + 4) = iVar6 + -1;
              }
              uVar11 = (int)uVar13 + 1;
            } while ((int)uVar11 < *(int *)((long)pvVar2 + 4));
          }
          iVar7 = (int)local_40;
          iVar6 = Pdr_ManCheckCube(p,iVar7,pPVar16,(Pdr_Set_t **)0x0,0,0,1);
          if (iVar6 != 0) {
            if (iVar6 == -1) {
              return -1;
            }
            pPVar8 = Pdr_ManReduceClause(p,iVar7,pPVar16);
            if (pPVar8 != (Pdr_Set_t *)0x0) {
              Pdr_SetDeref(pPVar16);
              pPVar16 = pPVar8;
            }
            Pdr_ManSolverAddClause(p,iVar15,pPVar16);
            puVar3 = local_48;
            uVar11 = local_48[1];
            if (0 < (int)uVar11) {
              uVar17 = 0;
              do {
                iVar6 = (int)uVar17;
                if (iVar6 < 0) goto LAB_005e78e2;
                pPVar8 = *(Pdr_Set_t **)(*(long *)(puVar3 + 2) + uVar17 * 8);
                iVar7 = Pdr_SetContains(pPVar8,pPVar16);
                if (iVar7 != 0) {
                  Pdr_SetDeref(pPVar8);
                  uVar11 = puVar3[1];
                  if ((long)(int)uVar11 < 1) goto LAB_005e7901;
                  if ((int)uVar11 <= iVar6) goto LAB_005e7920;
                  *(undefined8 *)(*(long *)(puVar3 + 2) + uVar17 * 8) =
                       *(undefined8 *)(*(long *)(puVar3 + 2) + -8 + (long)(int)uVar11 * 8);
                  puVar3[1] = uVar11 - 1;
                  iVar6 = iVar6 + -1;
                }
                uVar17 = (ulong)(iVar6 + 1U);
                uVar11 = puVar3[1];
              } while ((int)(iVar6 + 1U) < (int)uVar11);
            }
            uVar1 = *puVar3;
            if (uVar11 == uVar1) {
              if ((int)uVar1 < 0x10) {
                if (*(void **)(puVar3 + 2) == (void *)0x0) {
                  pvVar9 = malloc(0x80);
                }
                else {
                  pvVar9 = realloc(*(void **)(puVar3 + 2),0x80);
                }
                *(void **)(puVar3 + 2) = pvVar9;
                uVar11 = 0x10;
              }
              else {
                uVar11 = uVar1 * 2;
                if ((int)uVar11 <= (int)uVar1) goto LAB_005e7729;
                if (*(void **)(puVar3 + 2) == (void *)0x0) {
                  pvVar9 = malloc((ulong)uVar1 << 4);
                }
                else {
                  pvVar9 = realloc(*(void **)(puVar3 + 2),(ulong)uVar1 << 4);
                }
                *(void **)(puVar3 + 2) = pvVar9;
              }
              *puVar3 = uVar11;
            }
LAB_005e7729:
            uVar11 = puVar3[1];
            puVar3[1] = uVar11 + 1;
            *(Pdr_Set_t **)(*(long *)(puVar3 + 2) + (long)(int)uVar11 * 8) = pPVar16;
            iVar6 = *(int *)((long)pvVar2 + 4);
            if ((long)iVar6 < 1) goto LAB_005e7901;
            if (iVar6 <= iVar12) goto LAB_005e7920;
            *(undefined8 *)(*(long *)((long)pvVar2 + 8) + local_38 * 8) =
                 *(undefined8 *)(*(long *)((long)pvVar2 + 8) + -8 + (long)iVar6 * 8);
            *(int *)((long)pvVar2 + 4) = iVar6 + -1;
            iVar12 = iVar12 + -1;
          }
          uVar13 = (ulong)(iVar12 + 1U);
          iVar6 = *(int *)((long)pvVar2 + 4);
        } while ((int)(iVar12 + 1U) < iVar6);
      }
      if (iVar6 == 0) {
        iVar4 = 1;
      }
      uVar17 = uVar18;
      if ((int)uVar5 <= iVar15) goto LAB_005e77a2;
    }
  }
  else {
LAB_005e77a2:
    if ((0 < (int)local_50) && ((int)local_50 <= p->vClauses->nSize)) {
      pvVar2 = p->vClauses->pArray[uVar5];
      if (1 < (long)*(int *)((long)pvVar2 + 4)) {
        qsort(*(void **)((long)pvVar2 + 8),(long)*(int *)((long)pvVar2 + 4),8,Pdr_SetCompare);
      }
      if (0 < *(int *)((long)pvVar2 + 4)) {
        uVar17 = 0;
        do {
          uVar18 = uVar17 + 1;
          if ((long)uVar18 < (long)*(int *)((long)pvVar2 + 4)) {
            pPVar16 = *(Pdr_Set_t **)(*(long *)((long)pvVar2 + 8) + uVar17 * 8);
            uVar17 = uVar18 & 0xffffffff;
            do {
              iVar15 = (int)uVar17;
              if (iVar15 < 0) {
LAB_005e78e2:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                              ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
              }
              pPVar8 = *(Pdr_Set_t **)(*(long *)((long)pvVar2 + 8) + uVar17 * 8);
              iVar6 = Pdr_SetContains(pPVar8,pPVar16);
              if (iVar6 != 0) {
                Pdr_SetDeref(pPVar8);
                iVar6 = *(int *)((long)pvVar2 + 4);
                if ((long)iVar6 < 1) {
LAB_005e7901:
                  __assert_fail("p->nSize > 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                                ,0x1b7,"void *Vec_PtrEntryLast(Vec_Ptr_t *)");
                }
                if (iVar6 <= iVar15) {
LAB_005e7920:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                                ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
                }
                *(undefined8 *)(*(long *)((long)pvVar2 + 8) + uVar17 * 8) =
                     *(undefined8 *)(*(long *)((long)pvVar2 + 8) + -8 + (long)iVar6 * 8);
                *(int *)((long)pvVar2 + 4) = iVar6 + -1;
                iVar15 = iVar15 + -1;
              }
              uVar17 = (ulong)(iVar15 + 1U);
            } while ((int)(iVar15 + 1U) < *(int *)((long)pvVar2 + 4));
          }
          uVar17 = uVar18;
        } while ((long)uVar18 < (long)*(int *)((long)pvVar2 + 4));
      }
      iVar15 = clock_gettime(3,&local_60);
      if (iVar15 < 0) {
        lVar10 = -1;
      }
      else {
        lVar10 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
      }
      p->tPush = p->tPush + lVar10 + local_68;
      return iVar4;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecVec.h"
                ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
}

Assistant:

int Pdr_ManPushClauses( Pdr_Man_t * p )
{
    Pdr_Set_t * pTemp, * pCubeK, * pCubeK1;
    Vec_Ptr_t * vArrayK, * vArrayK1;
    int i, j, k, m, RetValue = 0, RetValue2, kMax = Vec_PtrSize(p->vSolvers)-1;
    int iStartFrame = p->pPars->fShiftStart ? p->iUseFrame : 1;
    int Counter = 0;
    abctime clk = Abc_Clock();
    assert( p->iUseFrame > 0 );
    Vec_VecForEachLevelStartStop( p->vClauses, vArrayK, k, iStartFrame, kMax )
    {
        Vec_PtrSort( vArrayK, (int (*)(void))Pdr_SetCompare );
        vArrayK1 = Vec_VecEntry( p->vClauses, k+1 );
        Vec_PtrForEachEntry( Pdr_Set_t *, vArrayK, pCubeK, j )
        {
            Counter++;

            // remove cubes in the same frame that are contained by pCubeK
            Vec_PtrForEachEntryStart( Pdr_Set_t *, vArrayK, pTemp, m, j+1 )
            {
                if ( !Pdr_SetContains( pTemp, pCubeK ) ) // pCubeK contains pTemp
                    continue;
                Pdr_SetDeref( pTemp );
                Vec_PtrWriteEntry( vArrayK, m, Vec_PtrEntryLast(vArrayK) );
                Vec_PtrPop(vArrayK);
                m--;
            }

            // check if the clause can be moved to the next frame
            RetValue2 = Pdr_ManCheckCube( p, k, pCubeK, NULL, 0, 0, 1 );
            if ( RetValue2 == -1 )
                return -1;
            if ( !RetValue2 )
                continue;

            {
                Pdr_Set_t * pCubeMin;
                pCubeMin = Pdr_ManReduceClause( p, k, pCubeK );
                if ( pCubeMin != NULL )
                {
//                Abc_Print( 1, "%d ", pCubeK->nLits - pCubeMin->nLits );
                    Pdr_SetDeref( pCubeK );
                    pCubeK = pCubeMin;
                }
            }

            // if it can be moved, add it to the next frame
            Pdr_ManSolverAddClause( p, k+1, pCubeK );
            // check if the clause subsumes others
            Vec_PtrForEachEntry( Pdr_Set_t *, vArrayK1, pCubeK1, i )
            {
                if ( !Pdr_SetContains( pCubeK1, pCubeK ) ) // pCubeK contains pCubeK1
                    continue;
                Pdr_SetDeref( pCubeK1 );
                Vec_PtrWriteEntry( vArrayK1, i, Vec_PtrEntryLast(vArrayK1) );
                Vec_PtrPop(vArrayK1);
                i--;
            }
            // add the last clause
            Vec_PtrPush( vArrayK1, pCubeK );
            Vec_PtrWriteEntry( vArrayK, j, Vec_PtrEntryLast(vArrayK) );
            Vec_PtrPop(vArrayK);
            j--;
        }
        if ( Vec_PtrSize(vArrayK) == 0 )
            RetValue = 1;
    }

    // clean up the last one
    vArrayK = Vec_VecEntry( p->vClauses, kMax );
    Vec_PtrSort( vArrayK, (int (*)(void))Pdr_SetCompare );
    Vec_PtrForEachEntry( Pdr_Set_t *, vArrayK, pCubeK, j )
    {
        // remove cubes in the same frame that are contained by pCubeK
        Vec_PtrForEachEntryStart( Pdr_Set_t *, vArrayK, pTemp, m, j+1 )
        {
            if ( !Pdr_SetContains( pTemp, pCubeK ) ) // pCubeK contains pTemp
                continue;
/*
            Abc_Print( 1, "===\n" );
            Pdr_SetPrint( stdout, pCubeK, Aig_ManRegNum(p->pAig), NULL );
            Abc_Print( 1, "\n" );
            Pdr_SetPrint( stdout, pTemp, Aig_ManRegNum(p->pAig), NULL );
            Abc_Print( 1, "\n" );
*/
            Pdr_SetDeref( pTemp );
            Vec_PtrWriteEntry( vArrayK, m, Vec_PtrEntryLast(vArrayK) );
            Vec_PtrPop(vArrayK);
            m--;
        }
    }
    p->tPush += Abc_Clock() - clk;
    return RetValue;
}